

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utFindInvalidData.cpp
# Opt level: O2

void __thiscall
utFindInvalidDataProcess_testStepNegativeResult_Test::TestBody
          (utFindInvalidDataProcess_testStepNegativeResult_Test *this)

{
  aiMesh *paVar1;
  aiVector3D *paVar2;
  uint i;
  long lVar3;
  char *pcVar4;
  char *in_R9;
  AssertHelper local_70;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  AssertHelper local_38;
  
  paVar1 = (this->super_utFindInvalidDataProcess).mMesh;
  memset(paVar1->mNormals,0,(ulong)paVar1->mNumVertices * 0xc);
  paVar1 = (this->super_utFindInvalidDataProcess).mMesh;
  memset(paVar1->mBitangents,0,(ulong)paVar1->mNumVertices * 0xc);
  paVar2 = ((this->super_utFindInvalidDataProcess).mMesh)->mTextureCoords[2];
  paVar2[0x1c7].x = NAN;
  paVar2[0x1c7].y = NAN;
  paVar2[0x1c7].z = NAN;
  Assimp::FindInvalidDataProcess::ProcessMesh
            ((this->super_utFindInvalidDataProcess).mProcess,
             (this->super_utFindInvalidDataProcess).mMesh);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  gtest_ar_.success_ =
       ((this->super_utFindInvalidDataProcess).mMesh)->mVertices != (aiVector3D *)0x0;
  if (!gtest_ar_.success_) {
    testing::Message::Message((Message *)&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar_,
               (AssertionResult *)"NULL != mMesh->mVertices","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utFindInvalidData.cpp"
               ,0x76,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    std::__cxx11::string::~string((string *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_70);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  testing::internal::EqHelper<true>::Compare<aiVector3t<float>>
            ((EqHelper<true> *)&gtest_ar,"__null","mMesh->mNormals",(Secret *)0x0,
             ((this->super_utFindInvalidDataProcess).mMesh)->mNormals);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utFindInvalidData.cpp"
               ,0x77,pcVar4);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::internal::EqHelper<true>::Compare<aiVector3t<float>>
            ((EqHelper<true> *)&gtest_ar,"__null","mMesh->mTangents",(Secret *)0x0,
             ((this->super_utFindInvalidDataProcess).mMesh)->mTangents);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utFindInvalidData.cpp"
               ,0x78,pcVar4);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::internal::EqHelper<true>::Compare<aiVector3t<float>>
            ((EqHelper<true> *)&gtest_ar,"__null","mMesh->mBitangents",(Secret *)0x0,
             ((this->super_utFindInvalidDataProcess).mMesh)->mBitangents);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utFindInvalidData.cpp"
               ,0x79,pcVar4);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  for (lVar3 = 0; lVar3 != 2; lVar3 = lVar3 + 1) {
    gtest_ar_.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    gtest_ar_.success_ =
         ((this->super_utFindInvalidDataProcess).mMesh)->mTextureCoords[lVar3] != (aiVector3D *)0x0;
    if (!gtest_ar_.success_) {
      testing::Message::Message((Message *)&local_70);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar,(internal *)&gtest_ar_,
                 (AssertionResult *)"NULL != mMesh->mTextureCoords[i]","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_38,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utFindInvalidData.cpp"
                 ,0x7c,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
      testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_70);
      testing::internal::AssertHelper::~AssertHelper(&local_38);
      std::__cxx11::string::~string((string *)&gtest_ar);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_70);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_.message_);
  }
  for (lVar3 = 0; lVar3 != 6; lVar3 = lVar3 + 1) {
    testing::internal::EqHelper<true>::Compare<aiVector3t<float>>
              ((EqHelper<true> *)&gtest_ar,"__null","mMesh->mTextureCoords[i]",(Secret *)0x0,
               ((this->super_utFindInvalidDataProcess).mMesh)->mTextureCoords[lVar3 + 2]);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_);
      pcVar4 = "";
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_70,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utFindInvalidData.cpp"
                 ,0x80,pcVar4);
      testing::internal::AssertHelper::operator=(&local_70,(Message *)&gtest_ar_);
      testing::internal::AssertHelper::~AssertHelper(&local_70);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar_);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
  }
  return;
}

Assistant:

TEST_F(utFindInvalidDataProcess, testStepNegativeResult) {
    ::memset(mMesh->mNormals, 0, mMesh->mNumVertices*sizeof(aiVector3D) );
    ::memset(mMesh->mBitangents, 0, mMesh->mNumVertices*sizeof(aiVector3D) );

    mMesh->mTextureCoords[2][455] = aiVector3D( std::numeric_limits<float>::quiet_NaN() );

    mProcess->ProcessMesh(mMesh);

    EXPECT_TRUE(NULL != mMesh->mVertices);
    EXPECT_EQ(NULL, mMesh->mNormals);
    EXPECT_EQ(NULL, mMesh->mTangents);
    EXPECT_EQ(NULL, mMesh->mBitangents);

    for (unsigned int i = 0; i < 2; ++i) {
        EXPECT_TRUE(NULL != mMesh->mTextureCoords[i]);
    }

    for (unsigned int i = 2; i < AI_MAX_NUMBER_OF_TEXTURECOORDS; ++i) {
        EXPECT_EQ(NULL, mMesh->mTextureCoords[i]);
    }
}